

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

RuntimeFunction * __thiscall
Js::JavascriptLibrary::DefaultCreateFunction
          (JavascriptLibrary *this,FunctionInfo *functionInfo,int length,DynamicObject *prototype,
          DynamicType *functionType,PropertyId nameId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RuntimeFunction *pRVar4;
  
  if (0xf < (uint)nameId) {
    bVar2 = ScriptContext::IsTrackedPropertyId
                      ((this->super_JavascriptLibraryBase).scriptContext.ptr,nameId);
    if (bVar2) goto LAB_00a97601;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                              ,0x1348,
                              "(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId))"
                              ,
                              "nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId)"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  *puVar3 = 0;
LAB_00a97601:
  pRVar4 = DefaultCreateFunction
                     (this,functionInfo,length,prototype,functionType,
                      (Var)((ulong)(uint)nameId | 0x1000000000000));
  return pRVar4;
}

Assistant:

RuntimeFunction* JavascriptLibrary::DefaultCreateFunction(FunctionInfo * functionInfo, int length, DynamicObject * prototype, DynamicType * functionType, PropertyId nameId)
    {
        Assert(nameId >= Js::InternalPropertyIds::Count && scriptContext->IsTrackedPropertyId(nameId));
        return DefaultCreateFunction(functionInfo, length, prototype, functionType, TaggedInt::ToVarUnchecked((int)nameId));
    }